

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcSampleVariablesTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::SampleShadingMaskCase::iterate(SampleShadingMaskCase *this)

{
  string *sampler;
  string *psVar1;
  int *piVar2;
  float *pfVar3;
  uint *puVar4;
  ChannelOrder *pCVar5;
  GLenum GVar6;
  ChannelOrder CVar7;
  ChannelType CVar8;
  TestLog *pTVar9;
  RenderContext *pRVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  SampleShadingMaskCase *pSVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  undefined4 uVar18;
  deUint32 dVar19;
  undefined4 extraout_var;
  TestError *pTVar20;
  int iVar21;
  int iVar22;
  char *pcVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  code *pcVar27;
  ulong uVar28;
  TestContext *this_00;
  uint uVar29;
  ulong uVar30;
  vector<int,_std::allocator<int>_> data;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> result;
  GLuint fbo;
  GLuint rbo;
  GLuint tex;
  GLint maxSamples;
  GLuint fboMs;
  PixelBufferAccess pixels;
  TextureLevel results;
  undefined1 local_2f8 [8];
  TextureFormat TStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  long local_2d0;
  undefined1 local_2c8 [8];
  pointer local_2c0;
  undefined1 local_2b8 [24];
  int local_2a0;
  allocator<char> local_292;
  allocator<char> local_291;
  SampleShadingMaskCase *local_290;
  undefined1 local_288 [8];
  TextureFormat TStack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  int local_254;
  string local_250;
  TextureFormat *local_230;
  string *local_228;
  undefined4 local_220;
  undefined4 local_21c;
  string local_218;
  value_type local_1f8;
  undefined1 local_1d8 [8];
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  int local_1b0;
  pointer local_1a8;
  pointer pbStack_1a0;
  int local_198;
  float *local_190;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_148;
  undefined1 local_128 [32];
  ShaderProgram local_108;
  
  pTVar9 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar16 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar26 = CONCAT44(extraout_var,iVar16);
  if ((this->m_glslVersion == GLSL_VERSION_310_ES) &&
     (bVar15 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,
                          "GL_OES_sample_variables"), !bVar15)) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar23 = "GL_OES_sample_variables";
LAB_00dcbbb6:
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_NOT_SUPPORTED,pcVar23);
    return STOP;
  }
  uVar17 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if (((uVar17 & 0x300) == 0x100) ||
     (bVar15 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,
                          "GL_EXT_color_buffer_float"), bVar15)) {
    GVar6 = this->m_internalFormat;
  }
  else {
    bVar15 = glu::ContextInfo::isExtensionSupported
                       (((this->super_TestCase).m_context)->m_contextInfo,
                        "GL_ARB_color_buffer_float");
    GVar6 = this->m_internalFormat;
    if (GVar6 == 0x8814 && !bVar15) {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar23 = "Internalformat rgba32f not supported";
      goto LAB_00dcbbb6;
    }
  }
  CVar7 = (this->m_texFormat).order;
  CVar8 = (this->m_texFormat).type;
  if ((CVar8 != HALF_FLOAT || CVar7 != RGBA) &&
      ((CVar7 != R && CVar7 != RG) && CVar7 != RGBA || CVar8 != FLOAT)) {
    if ((CVar8 == UNSIGNED_INT8) || (CVar8 == SIGNED_INT8)) {
      (**(code **)(lVar26 + 0x868))(0x9110,&local_254);
      if (local_254 < this->m_samples) {
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar23 = "Test sample count greater than MAX_INTEGER_SAMPLES";
        goto LAB_00dcbbb6;
      }
    }
    else {
      (**(code **)(lVar26 + 0x868))(0x8d57,&local_254);
      if (local_254 < this->m_samples) {
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar23 = "Test sample count greater than MAX_SAMPLES";
        goto LAB_00dcbbb6;
      }
    }
  }
  else {
    (**(code **)(lVar26 + 0x880))(0x9100,GVar6,0x80a9,1,&local_254);
    if (local_254 < this->m_samples) {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar23 = "Test sample count greater than samples that the format supports";
      goto LAB_00dcbbb6;
    }
  }
  (**(code **)(lVar26 + 0x6f8))(1,&local_258);
  if (this->m_samples == 0) {
    uVar18 = 0xde1;
    (**(code **)(lVar26 + 0xb8))(0xde1,local_258);
    (**(code **)(lVar26 + 0x1380))(0xde1,1,this->m_internalFormat,0x10,0x10);
    uVar30 = (ulong)(this->m_texFormat).type;
    if ((uVar30 < 0x24) && ((0x848000000U >> (uVar30 & 0x3f) & 1) != 0)) {
      uVar18 = 0xde1;
      (**(code **)(lVar26 + 0x1360))(0xde1,0x2800,0x2600);
      (**(code **)(lVar26 + 0x1360))(0xde1,0x2801,0x2600);
    }
  }
  else {
    uVar18 = 0x9100;
    (**(code **)(lVar26 + 0xb8))(0x9100);
    (**(code **)(lVar26 + 0x1390))(0x9100,this->m_samples,this->m_internalFormat,0x10,0x10);
  }
  (**(code **)(lVar26 + 0x6d0))(1,&local_21c);
  (**(code **)(lVar26 + 0x78))(0x8d40,local_21c);
  (**(code **)(lVar26 + 0x6a0))(0x8d40,0x8ce0,uVar18,local_258,0);
  (**(code **)(lVar26 + 0x1a00))(0,0,0x10,0x10);
  CVar8 = (this->m_texFormat).type;
  if (CVar8 == UNSIGNED_INT8) {
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x100000000;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x100000000;
    (**(code **)(lVar26 + 0x1b8))(0x1800,0);
  }
  else if (CVar8 == SIGNED_INT8) {
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x100000000;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x100000000;
    (**(code **)(lVar26 + 0x1b0))(0x1800,0);
  }
  else {
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x3f80000000000000;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
    (**(code **)(lVar26 + 0x1a8))(0x1800,0);
  }
  pRVar10 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_288 = (undefined1  [8])&local_278;
  local_220 = uVar18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,
             "${VERSION_DECL}\nin highp vec2 a_position;\nvoid main()\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,"");
  sampler = &this->m_sampler;
  psVar1 = &this->m_outType;
  specializeVersion((string *)local_2f8,(string *)local_288,this->m_glslVersion,sampler,psVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2c8,(char *)local_2f8,(allocator<char> *)&local_25c);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,
             "${VERSION_DECL}\n${OES_SV_RQ}layout(location = 0) out highp ${OUT_TYPE} o_color;\nuniform int u_sampleMask;\nvoid main()\n{\n    for (int i = 0; i < (gl_NumSamples + 31) / 32; ++i) {\n        gl_SampleMask[i] = u_sampleMask & gl_SampleMaskIn[i];\n    }\n    o_color = ${OUT_TYPE}(1, 0, 0, 1);\n}\n"
             ,"");
  specializeVersion(&local_218,&local_250,this->m_glslVersion,sampler,psVar1);
  local_290 = (SampleShadingMaskCase *)pTVar9;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,local_218._M_dataplus._M_p,(allocator<char> *)&local_260);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1d8,0,0xac);
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,(value_type *)local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1c0,&local_1f8);
  local_228 = psVar1;
  glu::ShaderProgram::ShaderProgram(&local_108,pRVar10,(ProgramSources *)local_1d8);
  local_230 = &this->m_texFormat;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148);
  lVar25 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + lVar25));
    lVar25 = lVar25 + -0x18;
  } while (lVar25 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8,local_2b8._0_8_ + 1);
  }
  if (local_2f8 != (undefined1  [8])(local_2f8 + 0x10)) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  local_2d0 = lVar26;
  if (local_288 != (undefined1  [8])&local_278) {
    operator_delete((void *)local_288,local_278._M_allocated_capacity + 1);
  }
  glu::operator<<((TestLog *)local_290,&local_108);
  if (local_108.m_program.m_info.linkOk == false) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar20,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
               ,0x169);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(local_2d0 + 0x1680))(local_108.m_program.m_program);
  pcVar27 = *(code **)(local_2d0 + 0x14f0);
  uVar18 = (**(code **)(local_2d0 + 0xb48))(local_108.m_program.m_program,"u_sampleMask");
  (*pcVar27)(uVar18,this->m_sampleMask);
  local_2f8 = (undefined1  [8])(local_2f8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"a_position","");
  local_2c8._0_4_ = 1;
  local_2c0 = (pointer)(local_2b8 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,local_2f8,(char *)((long)local_2f8 + (long)TStack_2f0));
  lVar26 = local_2d0;
  local_2a0 = 0;
  local_1d8._0_4_ = local_2c8._0_4_;
  local_1d0._M_p = (pointer)&local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_2c0,
             (undefined1 *)((long)local_2c0->m_data + local_2b8._0_8_));
  local_1b0 = local_2a0;
  local_1a8 = (pointer)0x8;
  pbStack_1a0 = (pointer)0x400000002;
  local_198 = 0;
  local_190 = iterate::position;
  if (local_2c0 != (pointer)(local_2b8 + 8)) {
    operator_delete(local_2c0,local_2b8._8_8_ + 1);
  }
  if (local_2f8 != (undefined1  [8])(local_2f8 + 0x10)) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  local_2c8 = (undefined1  [8])&DAT_600000001;
  local_2c0 = (pointer)CONCAT44(local_2c0._4_4_,1);
  local_2b8._0_8_ = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_108.m_program.m_program,1,
            (VertexArrayBinding *)local_1d8,(PrimitiveList *)local_2c8,(DrawUtilCallback *)0x0);
  dVar19 = (**(code **)(lVar26 + 0x800))();
  glu::checkError(dVar19,"Draw quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                  ,0x179);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_p != &local_1c0) {
    operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
  }
  glu::ShaderProgram::~ShaderProgram(&local_108);
  pcVar27 = *(code **)(lVar26 + 0x78);
  iVar16 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
  (*pcVar27)(0x8d40,iVar16);
  (**(code **)(lVar26 + 0x440))(1,&local_21c);
  iVar16 = this->m_samples << 4;
  if (this->m_samples == 0) {
    iVar16 = 0x10;
  }
  (**(code **)(lVar26 + 0x6e8))(1,&local_25c);
  (**(code **)(lVar26 + 0xa0))(0x8d41,local_25c);
  (**(code **)(lVar26 + 0x1238))(0x8d41,this->m_internalFormat,iVar16,0x10);
  (**(code **)(local_2d0 + 0x6d0))(1,&local_260);
  lVar26 = local_2d0;
  (**(code **)(local_2d0 + 0x78))(0x8d40,local_260);
  (**(code **)(lVar26 + 0x688))(0x8d40,0x8ce0,0x8d41,local_25c);
  (**(code **)(lVar26 + 0x1a00))(0,0,iVar16,0x10);
  pRVar10 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_288 = (undefined1  [8])&local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,
             "${VERSION_DECL}\nin highp vec2 a_position;\nvoid main(void)\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,"");
  psVar1 = local_228;
  specializeVersion((string *)local_2f8,(string *)local_288,this->m_glslVersion,sampler,local_228);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2c8,(char *)local_2f8,&local_291);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,
             "${VERSION_DECL}\nuniform highp ${SAMPLER} u_tex;\nuniform highp ${SAMPLER}MS u_texMS;\nuniform int u_samples;\nlayout(location = 0) out highp ${OUT_TYPE} o_color;\nvoid main(void)\n{\n    if (u_samples > 0) {\n        ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n        int sampleId = int(gl_FragCoord.x) % u_samples;\n        o_color = texelFetch(u_texMS, coord, sampleId);\n    } else {\n        ivec2 coord = ivec2(gl_FragCoord.x, gl_FragCoord.y);\n       o_color = texelFetch(u_tex, coord, 0);\n    }\n}\n"
             ,"");
  specializeVersion(&local_218,&local_250,this->m_glslVersion,sampler,psVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,local_218._M_dataplus._M_p,&local_292);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1d8,0,0xac);
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,(value_type *)local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1c0,&local_1f8);
  glu::ShaderProgram::ShaderProgram(&local_108,pRVar10,(ProgramSources *)local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148);
  lVar26 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + lVar26));
    lVar26 = lVar26 + -0x18;
  } while (lVar26 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8,local_2b8._0_8_ + 1);
  }
  if (local_2f8 != (undefined1  [8])(local_2f8 + 0x10)) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  if (local_288 != (undefined1  [8])&local_278) {
    operator_delete((void *)local_288,local_278._M_allocated_capacity + 1);
  }
  glu::operator<<((TestLog *)local_290,&local_108);
  if (local_108.m_program.m_info.linkOk == false) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar20,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
               ,0x1ae);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(local_2d0 + 0x1680))(local_108.m_program.m_program);
  pcVar27 = *(code **)(local_2d0 + 0x14f0);
  uVar18 = (**(code **)(local_2d0 + 0xb48))(local_108.m_program.m_program,"u_samples");
  (*pcVar27)(uVar18,this->m_samples);
  pcVar27 = *(code **)(local_2d0 + 0x14f0);
  bVar15 = this->m_samples < 1;
  if (bVar15) {
    uVar18 = (**(code **)(local_2d0 + 0xb48))(local_108.m_program.m_program,"u_tex");
    (*pcVar27)(uVar18,0);
    pcVar27 = *(code **)(local_2d0 + 0x14f0);
    uVar18 = (**(code **)(local_2d0 + 0xb48))(local_108.m_program.m_program,"u_texMS");
  }
  else {
    uVar18 = (**(code **)(local_2d0 + 0xb48))(local_108.m_program.m_program,"u_tex");
    (*pcVar27)(uVar18,1);
    pcVar27 = *(code **)(local_2d0 + 0x14f0);
    uVar18 = (**(code **)(local_2d0 + 0xb48))(local_108.m_program.m_program,"u_texMS");
  }
  (*pcVar27)(uVar18,bVar15);
  local_2f8 = (undefined1  [8])(local_2f8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"a_position","");
  local_2c8._0_4_ = 1;
  local_2c0 = (pointer)(local_2b8 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,local_2f8,(pointer)((long)TStack_2f0 + (long)local_2f8));
  local_2a0 = 0;
  local_1d8._0_4_ = local_2c8._0_4_;
  local_1d0._M_p = (pointer)&local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_2c0,
             (undefined1 *)((long)local_2c0->m_data + local_2b8._0_8_));
  local_1b0 = local_2a0;
  local_1a8 = (pointer)0x8;
  pbStack_1a0 = (pointer)0x400000002;
  local_198 = 0;
  local_190 = iterate()::position;
  if (local_2c0 != (pointer)(local_2b8 + 8)) {
    operator_delete(local_2c0,local_2b8._8_8_ + 1);
  }
  if (local_2f8 != (undefined1  [8])(local_2f8 + 0x10)) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  local_2c8 = (undefined1  [8])&DAT_600000001;
  local_2c0 = (pointer)CONCAT44(local_2c0._4_4_,1);
  local_2b8._0_8_ = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_108.m_program.m_program,1,
            (VertexArrayBinding *)local_1d8,(PrimitiveList *)local_2c8,(DrawUtilCallback *)0x0);
  dVar19 = (**(code **)(local_2d0 + 0x800))();
  glu::checkError(dVar19,"Draw quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                  ,0x1ca);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_p != &local_1c0) {
    operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
  }
  glu::ShaderProgram::~ShaderProgram(&local_108);
  tcu::TextureLevel::TextureLevel((TextureLevel *)&local_108,local_230,iVar16,0x10,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1d8,(TextureLevel *)&local_108);
  lVar26 = local_2d0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2c8,
             (long)((int)local_1d0._M_p * local_1d0._M_p._4_4_),(allocator_type *)local_2f8);
  if (local_1d8._4_4_ == UNSIGNED_INT8) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8,
               (long)(local_1d0._M_p._4_4_ * (int)local_1d0._M_p * 4),(allocator_type *)local_288);
    (**(code **)(lVar26 + 0x1220))
              (0,0,(ulong)local_1d0._M_p & 0xffffffff,local_1d0._M_p._4_4_,0x8d99,0x1405,local_2f8);
    if (TStack_2f0 != (TextureFormat)local_2f8) {
      uVar17 = 4;
      uVar30 = 0;
      do {
        puVar4 = (uint *)((long)local_2f8 + uVar30 * 4);
        uVar29 = puVar4[1];
        uVar12 = puVar4[2];
        uVar13 = puVar4[3];
        pfVar3 = (float *)((long)local_2c8 + (ulong)(uVar17 - 4 >> 2) * 0x10);
        *pfVar3 = ((float)(*puVar4 >> 0x10 | 0x53000000) - 5.497642e+11) +
                  (float)(*puVar4 & 0xffff | 0x4b000000);
        pfVar3[1] = ((float)(uVar29 >> 0x10 | 0x53000000) - 5.497642e+11) +
                    (float)(uVar29 & 0xffff | 0x4b000000);
        pfVar3[2] = ((float)(uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) +
                    (float)(uVar12 & 0xffff | 0x4b000000);
        pfVar3[3] = ((float)(uVar13 >> 0x10 | 0x53000000) - 5.497642e+11) +
                    (float)(uVar13 & 0xffff | 0x4b000000);
        uVar30 = (ulong)uVar17;
        uVar17 = uVar17 + 4;
      } while (uVar30 < (ulong)((long)TStack_2f0 - (long)local_2f8 >> 2));
    }
  }
  else {
    if (local_1d8._4_4_ != SIGNED_INT8) {
      glu::readPixels(((this->super_TestCase).m_context)->m_renderCtx,0,0,
                      (PixelBufferAccess *)local_1d8);
      goto LAB_00dcc932;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_2f8,
               (long)(local_1d0._M_p._4_4_ * (int)local_1d0._M_p * 4),(allocator_type *)local_288);
    (**(code **)(lVar26 + 0x1220))
              (0,0,(ulong)local_1d0._M_p & 0xffffffff,local_1d0._M_p._4_4_,0x8d99,0x1404,local_2f8);
    if (TStack_2f0 != (TextureFormat)local_2f8) {
      uVar17 = 4;
      uVar30 = 0;
      do {
        piVar2 = (int *)((long)local_2f8 + uVar30 * 4);
        iVar16 = piVar2[1];
        iVar21 = piVar2[2];
        iVar22 = piVar2[3];
        pfVar3 = (float *)((long)local_2c8 + (ulong)(uVar17 - 4 >> 2) * 0x10);
        *pfVar3 = (float)*piVar2;
        pfVar3[1] = (float)iVar16;
        pfVar3[2] = (float)iVar21;
        pfVar3[3] = (float)iVar22;
        uVar30 = (ulong)uVar17;
        uVar17 = uVar17 + 4;
      } while (uVar30 < (ulong)((long)TStack_2f0 - (long)local_2f8 >> 2));
    }
  }
  if ((TextureFormat)local_2f8 != (TextureFormat)0x0) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity - (long)local_2f8);
  }
LAB_00dcc932:
  iVar16 = this->m_samples;
  bVar15 = true;
  iVar21 = 0;
  local_290 = this;
  do {
    local_230 = (TextureFormat *)(ulong)(uint)(iVar21 << 4);
    iVar22 = 0;
    do {
      uVar17 = iVar16 + (uint)(iVar16 == 0);
      local_228 = (string *)CONCAT44(local_228._4_4_,iVar22);
      if (0 < (int)uVar17) {
        iVar11 = (int)local_230;
        uVar30 = 0;
        do {
          uVar29 = (uint)uVar30;
          if ((local_1d8._4_4_ == UNSIGNED_INT8) || (local_1d8._4_4_ == SIGNED_INT8)) {
            local_2f8 = *(undefined1 (*) [8])
                         ((long)local_2c8 + (long)(int)(uVar29 + uVar17 * iVar22 + iVar11) * 0x10);
            TStack_2f0 = ((TextureFormat *)
                         ((long)local_2c8 + (long)(int)(uVar29 + uVar17 * iVar22 + iVar11) * 0x10))
                         [1];
          }
          else {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_288,(int)local_1d8,uVar17 * iVar22 + uVar29,
                       iVar21);
            local_2f8 = local_288;
            TStack_2f0 = TStack_280;
            iVar16 = local_290->m_samples;
          }
          if ((iVar16 == 0) || (((uint)local_290->m_sampleMask >> (uVar29 & 0x1f) & 1) != 0)) {
            local_288._0_4_ = 0x3f800000;
            local_288._4_4_ = SNORM_INT8;
            TStack_280.order = R;
            TStack_280.type = 0x3f800000;
            if (((float)local_2f8._0_4_ == 1.0) && (!NAN((float)local_2f8._0_4_))) {
              uVar28 = 0xffffffffffffffff;
              do {
                if (uVar28 == 2) goto LAB_00dccaab;
                lVar26 = uVar28 * 4;
                uVar24 = uVar28 + 1;
                pCVar5 = &TStack_280.order + uVar28;
              } while ((*(float *)(local_2f8 + lVar26 + 8) == (float)*pCVar5) &&
                      (uVar28 = uVar24,
                      !NAN(*(float *)(local_2f8 + lVar26 + 8)) && !NAN((float)*pCVar5)));
              goto LAB_00dccaa3;
            }
LAB_00dccaa9:
            bVar15 = false;
          }
          else {
            local_288._0_4_ = R;
            local_288._4_4_ = 0x3f800000;
            TStack_280.order = R;
            TStack_280.type = 0x3f800000;
            if (((float)local_2f8._0_4_ != 0.0) || (NAN((float)local_2f8._0_4_))) goto LAB_00dccaa9;
            uVar28 = 0xffffffffffffffff;
            do {
              if (uVar28 == 2) goto LAB_00dccaab;
              lVar26 = uVar28 * 4;
              uVar24 = uVar28 + 1;
              pCVar5 = &TStack_280.order + uVar28;
            } while ((*(float *)(local_2f8 + lVar26 + 8) == (float)*pCVar5) &&
                    (uVar28 = uVar24,
                    !NAN(*(float *)(local_2f8 + lVar26 + 8)) && !NAN((float)*pCVar5)));
LAB_00dccaa3:
            if (uVar24 < 3) goto LAB_00dccaa9;
          }
LAB_00dccaab:
          TStack_280.order = R;
          TStack_280.type = 0x3f800000;
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar17);
      }
      pSVar14 = local_290;
      lVar26 = local_2d0;
      iVar22 = (int)local_228 + 1;
    } while (iVar22 != 0x10);
    iVar21 = iVar21 + 1;
    if (iVar21 == 0x10) {
      pcVar27 = *(code **)(local_2d0 + 0x78);
      iVar16 = (*((local_290->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
      (*pcVar27)(0x8d40,iVar16);
      (**(code **)(lVar26 + 0x440))(1,&local_260);
      (**(code **)(lVar26 + 0xa0))(0x8d41,0);
      (**(code **)(lVar26 + 0x460))(1,&local_25c);
      (**(code **)(lVar26 + 0xb8))(local_220,0);
      (**(code **)(lVar26 + 0x480))(1,&local_258);
      pcVar23 = "Fail";
      if (bVar15) {
        pcVar23 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((pSVar14->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar15 & QP_TEST_RESULT_FAIL,pcVar23);
      if (local_2c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2c8,local_2b8._0_8_ - (long)local_2c8);
      }
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&local_108);
      return STOP;
    }
  } while( true );
}

Assistant:

SampleShadingMaskCase::IterateResult SampleShadingMaskCase::iterate()
{
	TestLog&			  log			  = m_testCtx.getLog();
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	bool				  isOk			  = true;
	bool				  supportsRgba32f = false;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_variables"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_variables");
		return STOP;
	}

	supportsRgba32f = isContextTypeGLCore(m_context.getRenderContext().getType()) ?
						  true :
						  (m_context.getContextInfo().isExtensionSupported("GL_EXT_color_buffer_float") ||
						   m_context.getContextInfo().isExtensionSupported("GL_ARB_color_buffer_float"));

	if (m_internalFormat == GL_RGBA32F && !supportsRgba32f)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Internalformat rgba32f not supported");
		return STOP;
	}

	GLint maxSamples;
	if (((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RG)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::R)) ||
		((m_texFormat.type == tcu::TextureFormat::HALF_FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)))
	{
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, m_internalFormat, GL_SAMPLES, 1, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED,
									"Test sample count greater than samples that the format supports");
			return STOP;
		}
	}
	else if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			 m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Test sample count greater than MAX_INTEGER_SAMPLES");
			return STOP;
		}
	}
	else
	{
		gl.getIntegerv(GL_MAX_SAMPLES, &maxSamples);
		if (m_samples > maxSamples)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Test sample count greater than MAX_SAMPLES");
			return STOP;
		}
	}

	// Create a multisample texture, or a regular texture if samples is zero.
	GLuint tex;
	gl.genTextures(1, &tex);
	GLenum target;
	if (m_samples)
	{
		target = GL_TEXTURE_2D_MULTISAMPLE;
		gl.bindTexture(target, tex);
		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, m_samples, m_internalFormat, WIDTH, HEIGHT, GL_FALSE);
	}
	else
	{
		target = GL_TEXTURE_2D;
		gl.bindTexture(target, tex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_internalFormat, WIDTH, HEIGHT);
		if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8 || m_texFormat.type == tcu::TextureFormat::FLOAT)
		{
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		}
	}

	// Create a framebuffer with the texture attached and clear to "green".
	GLuint fboMs;
	gl.genFramebuffers(1, &fboMs);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fboMs);
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, target, tex, 0);
	gl.viewport(0, 0, WIDTH, HEIGHT);
	if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8)
	{
		GLint color[4] = { 0, 1, 0, 1 };
		gl.clearBufferiv(GL_COLOR, 0, color);
	}
	else if (m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		GLuint color[4] = { 0, 1, 0, 1 };
		gl.clearBufferuiv(GL_COLOR, 0, color);
	}
	else
	{
		GLfloat color[4] = { 0.0f, 1.0f, 0.0f, 1.0f };
		gl.clearBufferfv(GL_COLOR, 0, color);
	}

	static deUint16 const quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	{
		// Draw a quad setting all samples to "red". We only expect "red"
		// to be written if the sample mask bit for that sample is 1.

		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main()\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SV_RQ}"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "uniform int u_sampleMask;\n"
								 "void main()\n"
								 "{\n"
								 "    for (int i = 0; i < (gl_NumSamples + 31) / 32; ++i) {\n"
								 "        gl_SampleMask[i] = u_sampleMask & gl_SampleMaskIn[i];\n"
								 "    }\n"
								 "    o_color = ${OUT_TYPE}(1, 0, 0, 1);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		static float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_sampleMask"), m_sampleMask);

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fboMs);

	GLsizei width = WIDTH * ((m_samples) ? m_samples : 1);

	GLuint rbo;
	gl.genRenderbuffers(1, &rbo);
	gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	gl.renderbufferStorage(GL_RENDERBUFFER, m_internalFormat, width, HEIGHT);

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
	gl.viewport(0, 0, width, HEIGHT);

	{
		// Resolve the multi-sample texture into a render-buffer sized such that
		// the width can hold all samples of a pixel.
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main(void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "uniform highp ${SAMPLER} u_tex;\n"
								 "uniform highp ${SAMPLER}MS u_texMS;\n"
								 "uniform int u_samples;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main(void)\n"
								 "{\n"
								 "    if (u_samples > 0) {\n"
								 "        ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n"
								 "        int sampleId = int(gl_FragCoord.x) % u_samples;\n"
								 "        o_color = texelFetch(u_texMS, coord, sampleId);\n"
								 "    } else {\n"
								 "        ivec2 coord = ivec2(gl_FragCoord.x, gl_FragCoord.y);\n"
								 "       o_color = texelFetch(u_tex, coord, 0);\n"
								 "    }\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		static float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_samples"), m_samples);
		if (m_samples > 0)
		{
			// only MS sampler needed, TU 1 is not used
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 1);
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_texMS"), 0);
		}
		else
		{
			// only non-MS sampler needed, TU 1 is not used
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 0);
			gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_texMS"), 1);
		}

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	tcu::TextureLevel	  results(m_texFormat, width, HEIGHT);
	tcu::PixelBufferAccess pixels = results.getAccess();
	std::vector<tcu::Vec4> result(pixels.getHeight() * pixels.getWidth());

	if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8)
	{
		std::vector<GLint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
	}
	else if (pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		std::vector<GLuint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_UNSIGNED_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
	}
	else
	{
		glu::readPixels(m_context.getRenderContext(), 0, 0, pixels);
	}

	for (int y = 0; y < HEIGHT; ++y)
	{
		for (int x = 0; x < WIDTH; ++x)
		{
			GLint samples = (m_samples) ? m_samples : 1;
			for (int sample = 0; sample < samples; ++sample)
			{
				tcu::Vec4 pixel;
				if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8 ||
					pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
				{
					pixel = result[y * WIDTH + x * samples + sample];
				}
				else
				{
					pixel = pixels.getPixel(x * samples + sample, y);
				}

				// Make sure only those samples where the sample mask bit is
				// non-zero have the "red" pixel values.
				if (!m_samples || (m_sampleMask & (1 << sample)))
				{
					if (pixel != tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f))
					{
						isOk = false;
					}
				}
				else
				{
					if (pixel != tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f))
					{
						isOk = false;
					}
				}
			}
		}
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fbo);

	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	gl.deleteRenderbuffers(1, &rbo);

	gl.bindTexture(target, 0);
	gl.deleteTextures(1, &tex);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}